

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O0

void Godunov::ComputeAdvectiveVel
               (Box *xbx,Box *ybx,Box *zbx,Array4<double> *u_ad,Array4<double> *v_ad,
               Array4<double> *w_ad,Array4<const_double> *Imx,Array4<const_double> *Imy,
               Array4<const_double> *Imz,Array4<const_double> *Ipx,Array4<const_double> *Ipy,
               Array4<const_double> *Ipz,Array4<const_double> *vel,Array4<const_double> *f,
               Box *domain,Real l_dt,BCRec *pbc,bool l_use_forces_in_trans)

{
  void *in_RCX;
  anon_class_368_10_2ab497f2 *in_RDX;
  anon_class_368_10_b342ec71 *in_RSI;
  anon_class_368_10_3bd140f0 *in_RDI;
  void *in_R8;
  void *in_R9;
  undefined8 in_XMM0_Qa;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  void *in_stack_00000038;
  void *in_stack_00000040;
  undefined8 *in_stack_00000048;
  byte in_stack_00000058;
  Dim3 dhi;
  Dim3 dlo;
  Box *in_stack_fffffffffffffa90;
  Box *in_stack_fffffffffffffa98;
  Box *in_stack_fffffffffffffaa0;
  undefined1 auStack_530 [64];
  byte local_4f0;
  undefined8 local_4e8;
  undefined1 auStack_4e0 [72];
  undefined1 auStack_498 [64];
  undefined8 local_458;
  undefined4 local_450;
  undefined8 local_44c;
  undefined4 local_444;
  undefined1 auStack_440 [64];
  undefined1 local_400 [64];
  undefined1 auStack_3c0 [64];
  byte local_380;
  undefined8 local_378;
  undefined1 auStack_370 [72];
  undefined1 auStack_328 [64];
  undefined8 local_2e8;
  undefined4 local_2e0;
  undefined8 local_2dc;
  undefined4 local_2d4;
  undefined1 auStack_2d0 [64];
  undefined1 local_290 [64];
  undefined1 auStack_250 [64];
  byte local_210;
  undefined8 local_208;
  undefined1 auStack_200 [72];
  undefined1 auStack_1b8 [64];
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_16c;
  undefined4 local_164;
  undefined1 auStack_160 [64];
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_10c;
  undefined4 local_104;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  byte local_e1;
  undefined8 local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined4 local_84;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_c;
  
  local_e1 = in_stack_00000058 & 1;
  local_c = 0;
  local_8c = *(undefined4 *)in_stack_00000048;
  local_1c = 1;
  uStack_88 = *(undefined4 *)((long)in_stack_00000048 + 4);
  local_100 = *in_stack_00000048;
  local_2c = 2;
  local_f8 = *(undefined4 *)(in_stack_00000048 + 1);
  local_38 = (undefined8 *)((long)in_stack_00000048 + 0xc);
  local_3c = 0;
  local_68 = *(undefined4 *)local_38;
  local_48 = (undefined4 *)((long)in_stack_00000048 + 0xc);
  local_4c = 1;
  uStack_64 = *(undefined4 *)(in_stack_00000048 + 2);
  local_120 = *local_38;
  local_58 = (undefined4 *)((long)in_stack_00000048 + 0xc);
  local_5c = 2;
  local_118 = *(undefined4 *)((long)in_stack_00000048 + 0x14);
  local_10c = local_120;
  local_104 = local_118;
  local_f0 = local_100;
  local_e8 = local_f8;
  local_e0 = in_XMM0_Qa;
  local_d8 = in_R9;
  local_d0 = in_R8;
  local_c8 = in_RCX;
  local_a8 = local_100;
  local_a0 = local_f8;
  local_84 = local_f8;
  local_80 = local_120;
  local_78 = local_118;
  local_60 = local_118;
  memcpy(local_290,in_stack_00000020,0x3c);
  memcpy(auStack_250,in_stack_00000008,0x3c);
  local_210 = local_e1 & 1;
  local_208 = local_e0;
  memcpy(auStack_200,in_stack_00000040,0x3c);
  memcpy(auStack_1b8,in_stack_00000038,0x3c);
  local_178 = local_f0;
  local_170 = local_e8;
  local_16c = local_10c;
  local_164 = local_104;
  memcpy(auStack_160,local_c8,0x3c);
  memcpy(local_400,in_stack_00000028,0x3c);
  memcpy(auStack_3c0,in_stack_00000010,0x3c);
  local_380 = local_e1 & 1;
  local_378 = local_e0;
  memcpy(auStack_370,in_stack_00000040,0x3c);
  memcpy(auStack_328,in_stack_00000038,0x3c);
  local_2e8 = local_f0;
  local_2e0 = local_e8;
  local_2dc = local_10c;
  local_2d4 = local_104;
  memcpy(auStack_2d0,local_d0,0x3c);
  memcpy(&stack0xfffffffffffffa90,in_stack_00000030,0x3c);
  memcpy(auStack_530,in_stack_00000018,0x3c);
  local_4f0 = local_e1 & 1;
  local_4e8 = local_e0;
  memcpy(auStack_4e0,in_stack_00000040,0x3c);
  memcpy(auStack_498,in_stack_00000038,0x3c);
  local_458 = local_f0;
  local_450 = local_e8;
  local_44c = local_10c;
  local_444 = local_104;
  memcpy(auStack_440,local_d8,0x3c);
  amrex::
  ParallelFor<Godunov::ComputeAdvectiveVel(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double,amrex::BCRec_const*,bool)::__0,Godunov::ComputeAdvectiveVel(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double,amrex::BCRec_const*,bool)::__1,Godunov::ComputeAdvectiveVel(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double,amrex::BCRec_const*,bool)::__2>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,in_RDX,
             in_RSI,in_RDI);
  return;
}

Assistant:

void
Godunov::ComputeAdvectiveVel ( Box const& xbx,
                               Box const& ybx,
                               Box const& zbx,
                               Array4<Real> const& u_ad,
                               Array4<Real> const& v_ad,
                               Array4<Real> const& w_ad,
                               Array4<Real const> const& Imx,
                               Array4<Real const> const& Imy,
                               Array4<Real const> const& Imz,
                               Array4<Real const> const& Ipx,
                               Array4<Real const> const& Ipy,
                               Array4<Real const> const& Ipz,
                               Array4<Real const> const& vel,
                               Array4<Real const> const& f,
                               const Box& domain,
                               Real l_dt,
                               BCRec  const* pbc,
                               bool l_use_forces_in_trans)
{
    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    amrex::ParallelFor(AMREX_D_DECL(xbx, ybx, zbx),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about x-velocity on x-faces here
        constexpr int n = 0;

        Real lo = Ipx(i-1,j,k,n);
        Real hi = Imx(i  ,j,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i-1,j,k,n);
            hi += 0.5*l_dt*f(i  ,j,k,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, vel, lo, hi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        u_ad(i,j,k) = ltm ? 0. : st;
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about y-velocity on y-faces here
        constexpr int n = 1;

        Real lo = Ipy(i,j-1,k,n);
        Real hi = Imy(i,j  ,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j-1,k,n);
            hi += 0.5*l_dt*f(i,j  ,k,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, vel, lo, hi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        v_ad(i,j,k) = ltm ? 0. : st;
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about z-velocity on z-faces here
        constexpr int n = 2;

        Real lo = Ipz(i,j,k-1,n);
        Real hi = Imz(i,j,k  ,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j,k-1,n);
            hi += 0.5*l_dt*f(i,j,k  ,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, vel, lo, hi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        w_ad(i,j,k) = ltm ? 0. : st;
    }
    );
}